

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Function.cc
# Opt level: O2

void __thiscall
Pl_Function::Pl_Function
          (Pl_Function *this,char *identifier,Pipeline *next,writer_c_t fn,void *udata)

{
  Members *pMVar1;
  undefined8 uVar2;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  _Any_data __tmp;
  
  Pipeline::Pipeline(&this->super_Pipeline,identifier,next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_Function_002ac510;
  local_68._M_unused._M_object = (void *)0x0;
  std::make_unique<Pl_Function::Members,decltype(nullptr)>((void **)&this->m);
  pMVar1 = (this->m)._M_t.
           super___uniq_ptr_impl<Pl_Function::Members,_std::default_delete<Pl_Function::Members>_>.
           _M_t.
           super__Tuple_impl<0UL,_Pl_Function::Members_*,_std::default_delete<Pl_Function::Members>_>
           .super__Head_base<0UL,_Pl_Function::Members_*,_false>._M_head_impl;
  local_58 = (_Manager_type)0x0;
  p_Stack_50 = (_Invoker_type)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  __tmp._M_unused._M_object = operator_new(0x18);
  *(char **)__tmp._M_unused._0_8_ = identifier;
  *(writer_c_t *)((long)__tmp._M_unused._0_8_ + 8) = fn;
  *(void **)((long)__tmp._M_unused._0_8_ + 0x10) = udata;
  __tmp._8_8_ = local_68._8_8_;
  local_68._M_unused._0_8_ = (undefined8)*(undefined8 *)&(pMVar1->fn).super__Function_base;
  uVar2 = *(undefined8 *)((long)&(pMVar1->fn).super__Function_base + 8);
  *(undefined8 *)&(pMVar1->fn).super__Function_base = __tmp._M_unused._M_object;
  *(undefined8 *)((long)&(pMVar1->fn).super__Function_base + 8) = local_68._8_8_;
  local_58 = *(_Manager_type *)((long)&(pMVar1->fn).super__Function_base + 0x10);
  *(code **)((long)&(pMVar1->fn).super__Function_base + 0x10) =
       std::
       _Function_handler<void_(const_unsigned_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/Pl_Function.cc:28:13)>
       ::_M_manager;
  p_Stack_50 = (pMVar1->fn)._M_invoker;
  (pMVar1->fn)._M_invoker =
       std::
       _Function_handler<void_(const_unsigned_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/Pl_Function.cc:28:13)>
       ::_M_invoke;
  local_68._8_8_ = uVar2;
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  return;
}

Assistant:

Pl_Function::Pl_Function(char const* identifier, Pipeline* next, writer_c_t fn, void* udata) :
    Pipeline(identifier, next),
    m(std::make_unique<Members>(nullptr))
{
    m->fn = [identifier, fn, udata](unsigned char const* data, size_t len) {
        int code = fn(data, len, udata);
        if (code != 0) {
            throw std::runtime_error(
                std::string(identifier) + " function returned code " + std::to_string(code));
        }
    };
}